

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

ssh2_userkey * ppk_load_s(BinarySource *src,char *passphrase,char **errorstr)

{
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  strbuf *sb;
  char *pcVar4;
  ssh_keyalg *self;
  ushort **ppuVar5;
  ulong uVar6;
  ssh2_macalg *alg_00;
  ssh2_mac *m;
  ssh_key *psVar7;
  ptrlen pVar8;
  ptrlen pVar9;
  char *local_238;
  ssh2_mac *mac_1;
  ssh2_macalg *mac_alg;
  strbuf *psStack_1d0;
  _Bool free_macdata;
  strbuf *macdata;
  char realmac [65];
  byte local_178 [8];
  uchar binary [32];
  char local_12b;
  char local_12a;
  undefined1 local_129;
  long lStack_128;
  char s [3];
  size_t i_1;
  ppk_save_parameters params;
  char *error;
  uint fmt_version;
  _Bool is_mac;
  ppk_cipher *ppStack_e0;
  int i;
  ppk_cipher *ciphertype;
  ptrlen mackey;
  ptrlen cipheriv;
  ptrlen cipherkey;
  strbuf *passphrase_salt;
  strbuf *cipher_mac_keys_blob;
  strbuf *private_blob;
  strbuf *public_blob;
  ssh2_userkey *ret;
  ssh_keyalg *alg;
  char *mac;
  char *comment;
  char *encryption;
  char *b;
  char header [40];
  char **errorstr_local;
  char *passphrase_local;
  BinarySource *src_local;
  
  sb = strbuf_new();
  params.saltlen = 0;
  public_blob = (strbuf *)0x0;
  alg = (ssh_keyalg *)0x0;
  mac = (char *)0x0;
  comment = (char *)0x0;
  passphrase_salt = (strbuf *)0x0;
  cipher_mac_keys_blob = (strbuf *)0x0;
  private_blob = (strbuf *)0x0;
  _Var2 = read_header(src,(char *)&b);
  if (_Var2) {
    iVar3 = strcmp((char *)&b,"PuTTY-User-Key-File-3");
    if (iVar3 == 0) {
      error._4_4_ = 3;
    }
    else {
      iVar3 = strcmp((char *)&b,"PuTTY-User-Key-File-2");
      if (iVar3 == 0) {
        error._4_4_ = 2;
      }
      else {
        iVar3 = strcmp((char *)&b,"PuTTY-User-Key-File-1");
        if (iVar3 != 0) {
          iVar3 = strncmp((char *)&b,"PuTTY-User-Key-File-",0x14);
          if (iVar3 == 0) {
            params.saltlen = (size_t)anon_var_dwarf_2765d;
          }
          else {
            params.saltlen = (size_t)anon_var_dwarf_27674;
          }
          goto LAB_001391df;
        }
        old_keyfile_warning();
        error._4_4_ = 1;
      }
    }
    params.saltlen = (size_t)anon_var_dwarf_2768b;
    pcVar4 = read_body(src);
    if (pcVar4 != (char *)0x0) {
      self = find_pubkey_alg(pcVar4);
      if (self == (ssh_keyalg *)0x0) {
        safefree(pcVar4);
      }
      else {
        safefree(pcVar4);
        _Var2 = read_header(src,(char *)&b);
        if (((_Var2) && (iVar3 = strcmp((char *)&b,"Encryption"), iVar3 == 0)) &&
           (comment = read_body(src), comment != (char *)0x0)) {
          iVar3 = strcmp(comment,"aes256-cbc");
          if (iVar3 == 0) {
            ppStack_e0 = &ppk_cipher_aes256_cbc;
          }
          else {
            iVar3 = strcmp(comment,"none");
            if (iVar3 != 0) goto LAB_001391df;
            ppStack_e0 = &ppk_cipher_none;
          }
          _Var2 = read_header(src,(char *)&b);
          if (((_Var2) && (iVar3 = strcmp((char *)&b,"Comment"), iVar3 == 0)) &&
             (mac = read_body(src), (uchar *)mac != (uchar *)0x0)) {
            memset(&i_1,0,0x28);
            _Var2 = read_header(src,(char *)&b);
            if (((_Var2) && (iVar3 = strcmp((char *)&b,"Public-Lines"), iVar3 == 0)) &&
               (pcVar4 = read_body(src), pcVar4 != (char *)0x0)) {
              iVar3 = userkey_parse_line_counter(pcVar4);
              safefree(pcVar4);
              if (-1 < iVar3) {
                private_blob = strbuf_new();
                _Var2 = read_blob(src,iVar3,private_blob->binarysink_);
                if (_Var2) {
                  if ((2 < error._4_4_) && (ppStack_e0->keylen != 0)) {
                    _Var2 = read_header(src,(char *)&b);
                    if ((!_Var2) ||
                       ((iVar3 = strcmp((char *)&b,"Key-Derivation"), iVar3 != 0 ||
                        (pcVar4 = read_body(src), pcVar4 == (char *)0x0)))) goto LAB_001391df;
                    iVar3 = strcmp(pcVar4,"Argon2d");
                    if (iVar3 == 0) {
                      i_1._4_4_ = 0;
                    }
                    else {
                      iVar3 = strcmp(pcVar4,"Argon2i");
                      if (iVar3 == 0) {
                        i_1._4_4_ = 1;
                      }
                      else {
                        iVar3 = strcmp(pcVar4,"Argon2id");
                        if (iVar3 != 0) {
                          safefree(pcVar4);
                          goto LAB_001391df;
                        }
                        i_1._4_4_ = 2;
                      }
                    }
                    safefree(pcVar4);
                    _Var2 = read_header(src,(char *)&b);
                    if (((!_Var2) || (iVar3 = strcmp((char *)&b,"Argon2-Memory"), iVar3 != 0)) ||
                       (pcVar4 = read_body(src), pcVar4 == (char *)0x0)) goto LAB_001391df;
                    _Var2 = str_to_uint32_t(pcVar4,&params.fmt_version);
                    if (!_Var2) {
                      safefree(pcVar4);
                      goto LAB_001391df;
                    }
                    safefree(pcVar4);
                    _Var2 = read_header(src,(char *)&b);
                    if (((!_Var2) || (iVar3 = strcmp((char *)&b,"Argon2-Passes"), iVar3 != 0)) ||
                       (pcVar4 = read_body(src), pcVar4 == (char *)0x0)) goto LAB_001391df;
                    _Var2 = str_to_uint32_t(pcVar4,&params.argon2_mem);
                    if (!_Var2) {
                      safefree(pcVar4);
                      goto LAB_001391df;
                    }
                    safefree(pcVar4);
                    _Var2 = read_header(src,(char *)&b);
                    if (((!_Var2) || (iVar3 = strcmp((char *)&b,"Argon2-Parallelism"), iVar3 != 0))
                       || (pcVar4 = read_body(src), pcVar4 == (char *)0x0)) goto LAB_001391df;
                    _Var2 = str_to_uint32_t(pcVar4,(uint32_t *)&params.argon2_passes_auto);
                    if (!_Var2) {
                      safefree(pcVar4);
                      goto LAB_001391df;
                    }
                    safefree(pcVar4);
                    _Var2 = read_header(src,(char *)&b);
                    if (((!_Var2) || (iVar3 = strcmp((char *)&b,"Argon2-Salt"), iVar3 != 0)) ||
                       (pcVar4 = read_body(src), pcVar4 == (char *)0x0)) goto LAB_001391df;
                    for (lStack_128 = 0; pcVar4[lStack_128] != '\0'; lStack_128 = lStack_128 + 2) {
                      ppuVar5 = __ctype_b_loc();
                      if (((((*ppuVar5)[(int)(uint)(byte)pcVar4[lStack_128]] & 0x1000) == 0) ||
                          (pcVar4[lStack_128 + 1] == '\0')) ||
                         (ppuVar5 = __ctype_b_loc(),
                         ((*ppuVar5)[(int)(uint)(byte)pcVar4[lStack_128 + 1]] & 0x1000) == 0)) {
                        safefree(pcVar4);
                        goto LAB_001391df;
                      }
                      local_12b = pcVar4[lStack_128];
                      local_12a = pcVar4[lStack_128 + 1];
                      local_129 = 0;
                      uVar6 = strtoul(&local_12b,(char **)0x0,0x10);
                      BinarySink_put_byte(sb->binarysink_,(uchar)uVar6);
                    }
                    safefree(pcVar4);
                  }
                  _Var2 = read_header(src,(char *)&b);
                  if (((_Var2) && (iVar3 = strcmp((char *)&b,"Private-Lines"), iVar3 == 0)) &&
                     (pcVar4 = read_body(src), pcVar4 != (char *)0x0)) {
                    iVar3 = userkey_parse_line_counter(pcVar4);
                    safefree(pcVar4);
                    if (-1 < iVar3) {
                      cipher_mac_keys_blob = strbuf_new_nm();
                      _Var2 = read_blob(src,iVar3,cipher_mac_keys_blob->binarysink_);
                      if ((_Var2) && (_Var2 = read_header(src,(char *)&b), _Var2)) {
                        iVar3 = strcmp((char *)&b,"Private-MAC");
                        if (iVar3 == 0) {
                          alg = (ssh_keyalg *)read_body(src);
                          if (alg == (ssh_keyalg *)0x0) goto LAB_001391df;
                          bVar1 = true;
                        }
                        else {
                          iVar3 = strcmp((char *)&b,"Private-Hash");
                          if (((iVar3 != 0) || (error._4_4_ != 1)) ||
                             (alg = (ssh_keyalg *)read_body(src), alg == (ssh_keyalg *)0x0))
                          goto LAB_001391df;
                          bVar1 = false;
                        }
                        passphrase_salt = strbuf_new();
                        local_238 = passphrase;
                        if (passphrase == (char *)0x0) {
                          local_238 = anon_var_dwarf_248df + 10;
                        }
                        pVar8 = ptrlen_from_asciz(local_238);
                        pVar9 = ptrlen_from_strbuf(sb);
                        ssh2_ppk_derive_keys
                                  (error._4_4_,ppStack_e0,pVar8,passphrase_salt,
                                   (ptrlen *)&cipheriv.len,(ptrlen *)&mackey.len,
                                   (ptrlen *)&ciphertype,pVar9,(ppk_save_parameters *)&i_1);
                        if (cipher_mac_keys_blob->len % ppStack_e0->blocklen == 0) {
                          if (ppStack_e0 == &ppk_cipher_aes256_cbc) {
                            aes256_decrypt_pubkey
                                      ((void *)cipheriv.len,(void *)mackey.len,
                                       cipher_mac_keys_blob->u,(int)cipher_mac_keys_blob->len);
                          }
                          alg_00 = &ssh_hmac_sha256;
                          if (error._4_4_ < 3) {
                            alg_00 = &ssh_hmac_sha1;
                          }
                          psStack_1d0 = cipher_mac_keys_blob;
                          if (error._4_4_ != 1) {
                            psStack_1d0 = strbuf_new_nm();
                            BinarySink_put_stringz(psStack_1d0->binarysink_,self->ssh_id);
                            BinarySink_put_stringz(psStack_1d0->binarysink_,comment);
                            BinarySink_put_stringz(psStack_1d0->binarysink_,mac);
                            BinarySink_put_string
                                      (psStack_1d0->binarysink_,private_blob->s,private_blob->len);
                            BinarySink_put_string
                                      (psStack_1d0->binarysink_,cipher_mac_keys_blob->s,
                                       cipher_mac_keys_blob->len);
                          }
                          if (bVar1) {
                            m = ssh2_mac_new(alg_00,(ssh_cipher *)0x0);
                            ssh2_mac_setkey(m,_ciphertype);
                            ssh2_mac_start(m);
                            BinarySink_put_data(m->binarysink_,psStack_1d0->s,psStack_1d0->len);
                            ssh2_mac_genresult(m,local_178);
                            ssh2_mac_free(m);
                          }
                          else {
                            pVar8 = ptrlen_from_strbuf(psStack_1d0);
                            hash_simple(&ssh_sha1,pVar8,local_178);
                          }
                          if (error._4_4_ != 1) {
                            strbuf_free(psStack_1d0);
                          }
                          for (fmt_version = 0; (int)fmt_version < alg_00->len;
                              fmt_version = fmt_version + 1) {
                            sprintf(realmac + (long)(int)(fmt_version << 1) + -8,"%02x",
                                    (ulong)local_178[(int)fmt_version]);
                          }
                          iVar3 = strcmp((char *)alg,(char *)&macdata);
                          if (iVar3 == 0) {
                            public_blob = (strbuf *)safemalloc(1,0x10,0);
                            public_blob->u = (uchar *)mac;
                            mac = (char *)0x0;
                            pVar8 = ptrlen_from_strbuf(private_blob);
                            pVar9 = ptrlen_from_strbuf(cipher_mac_keys_blob);
                            psVar7 = ssh_key_new_priv(self,pVar8,pVar9);
                            public_blob->s = (char *)psVar7;
                            if (public_blob->s == (char *)0x0) {
                              safefree(public_blob);
                              public_blob = (strbuf *)0x0;
                              params.saltlen = (size_t)anon_var_dwarf_277f6;
                            }
                            else {
                              params.saltlen = 0;
                            }
                          }
                          else if (ppStack_e0->keylen == 0) {
                            params.saltlen = (size_t)anon_var_dwarf_277eb;
                            public_blob = (strbuf *)0x0;
                          }
                          else {
                            params.saltlen = (size_t)anon_var_dwarf_277d4;
                            public_blob = (strbuf *)&ssh2_wrong_passphrase;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    params.saltlen = (size_t)anon_var_dwarf_2760e;
  }
LAB_001391df:
  if (mac != (char *)0x0) {
    safefree(mac);
  }
  if (comment != (char *)0x0) {
    safefree(comment);
  }
  if (alg != (ssh_keyalg *)0x0) {
    safefree(alg);
  }
  if (private_blob != (strbuf *)0x0) {
    strbuf_free(private_blob);
  }
  if (cipher_mac_keys_blob != (strbuf *)0x0) {
    strbuf_free(cipher_mac_keys_blob);
  }
  if (passphrase_salt != (strbuf *)0x0) {
    strbuf_free(passphrase_salt);
  }
  strbuf_free(sb);
  if (errorstr != (char **)0x0) {
    *errorstr = (char *)params.saltlen;
  }
  return (ssh2_userkey *)public_blob;
}

Assistant:

ssh2_userkey *ppk_load_s(BinarySource *src, const char *passphrase,
                         const char **errorstr)
{
    char header[40], *b, *encryption, *comment, *mac;
    const ssh_keyalg *alg;
    ssh2_userkey *ret;
    strbuf *public_blob, *private_blob, *cipher_mac_keys_blob;
    strbuf *passphrase_salt = strbuf_new();
    ptrlen cipherkey, cipheriv, mackey;
    const struct ppk_cipher *ciphertype;
    int i;
    bool is_mac;
    unsigned fmt_version;
    const char *error = NULL;
    ppk_save_parameters params;

    ret = NULL;                        /* return NULL for most errors */
    encryption = comment = mac = NULL;
    public_blob = private_blob = cipher_mac_keys_blob = NULL;

    /* Read the first header line which contains the key type. */
    if (!read_header(src, header)) {
        error = "no header line found in key file";
        goto error;
    }
    if (0 == strcmp(header, "PuTTY-User-Key-File-3")) {
        fmt_version = 3;
    } else if (0 == strcmp(header, "PuTTY-User-Key-File-2")) {
        fmt_version = 2;
    } else if (0 == strcmp(header, "PuTTY-User-Key-File-1")) {
        /* this is an old key file; warn and then continue */
        old_keyfile_warning();
        fmt_version = 1;
    } else if (0 == strncmp(header, "PuTTY-User-Key-File-", 20)) {
        /* this is a key file FROM THE FUTURE; refuse it, but with a
         * more specific error message than the generic one below */
        error = "PuTTY key format too new";
        goto error;
    } else {
        error = "not a PuTTY SSH-2 private key";
        goto error;
    }
    error = "file format error";
    if ((b = read_body(src)) == NULL)
        goto error;
    /* Select key algorithm structure. */
    alg = find_pubkey_alg(b);
    if (!alg) {
        sfree(b);
        goto error;
    }
    sfree(b);

    /* Read the Encryption header line. */
    if (!read_header(src, header) || 0 != strcmp(header, "Encryption"))
        goto error;
    if ((encryption = read_body(src)) == NULL)
        goto error;
    if (!strcmp(encryption, "aes256-cbc")) {
        ciphertype = &ppk_cipher_aes256_cbc;
    } else if (!strcmp(encryption, "none")) {
        ciphertype = &ppk_cipher_none;
    } else {
        goto error;
    }

    /* Read the Comment header line. */
    if (!read_header(src, header) || 0 != strcmp(header, "Comment"))
        goto error;
    if ((comment = read_body(src)) == NULL)
        goto error;

    memset(&params, 0, sizeof(params)); /* in particular, sets
                                         * passes_auto=false */

    /* Read the Public-Lines header line and the public blob. */
    if (!read_header(src, header) || 0 != strcmp(header, "Public-Lines"))
        goto error;
    if ((b = read_body(src)) == NULL)
        goto error;
    i = userkey_parse_line_counter(b);
    sfree(b);
    if (i < 0)
        goto error;
    public_blob = strbuf_new();
    if (!read_blob(src, i, BinarySink_UPCAST(public_blob)))
        goto error;

    if (fmt_version >= 3 && ciphertype->keylen != 0) {
        /* Read Argon2 key derivation parameters. */
        if (!read_header(src, header) || 0 != strcmp(header, "Key-Derivation"))
            goto error;
        if ((b = read_body(src)) == NULL)
            goto error;
        if (!strcmp(b, "Argon2d")) {
            params.argon2_flavour = Argon2d;
        } else if (!strcmp(b, "Argon2i")) {
            params.argon2_flavour = Argon2i;
        } else if (!strcmp(b, "Argon2id")) {
            params.argon2_flavour = Argon2id;
        } else {
            sfree(b);
            goto error;
        }
        sfree(b);

        if (!read_header(src, header) || 0 != strcmp(header, "Argon2-Memory"))
            goto error;
        if ((b = read_body(src)) == NULL)
            goto error;
        if (!str_to_uint32_t(b, &params.argon2_mem)) {
            sfree(b);
            goto error;
        }
        sfree(b);

        if (!read_header(src, header) || 0 != strcmp(header, "Argon2-Passes"))
            goto error;
        if ((b = read_body(src)) == NULL)
            goto error;
        if (!str_to_uint32_t(b, &params.argon2_passes)) {
            sfree(b);
            goto error;
        }
        sfree(b);

        if (!read_header(src, header) ||
            0 != strcmp(header, "Argon2-Parallelism"))
            goto error;
        if ((b = read_body(src)) == NULL)
            goto error;
        if (!str_to_uint32_t(b, &params.argon2_parallelism)) {
            sfree(b);
            goto error;
        }
        sfree(b);

        if (!read_header(src, header) || 0 != strcmp(header, "Argon2-Salt"))
            goto error;
        if ((b = read_body(src)) == NULL)
            goto error;
        for (size_t i = 0; b[i]; i += 2) {
            if (isxdigit((unsigned char)b[i]) && b[i+1] &&
                isxdigit((unsigned char)b[i+1])) {
                char s[3];
                s[0] = b[i];
                s[1] = b[i+1];
                s[2] = '\0';
                put_byte(passphrase_salt, strtoul(s, NULL, 16));
            } else {
                sfree(b);
                goto error;
            }
        }
        sfree(b);
    }

    /* Read the Private-Lines header line and the Private blob. */
    if (!read_header(src, header) || 0 != strcmp(header, "Private-Lines"))
        goto error;
    if ((b = read_body(src)) == NULL)
        goto error;
    i = userkey_parse_line_counter(b);
    sfree(b);
    if (i < 0)
        goto error;
    private_blob = strbuf_new_nm();
    if (!read_blob(src, i, BinarySink_UPCAST(private_blob)))
        goto error;

    /* Read the Private-MAC or Private-Hash header line. */
    if (!read_header(src, header))
        goto error;
    if (0 == strcmp(header, "Private-MAC")) {
        if ((mac = read_body(src)) == NULL)
            goto error;
        is_mac = true;
    } else if (0 == strcmp(header, "Private-Hash") && fmt_version == 1) {
        if ((mac = read_body(src)) == NULL)
            goto error;
        is_mac = false;
    } else
        goto error;

    cipher_mac_keys_blob = strbuf_new();
    ssh2_ppk_derive_keys(fmt_version, ciphertype,
                         ptrlen_from_asciz(passphrase ? passphrase : ""),
                         cipher_mac_keys_blob, &cipherkey, &cipheriv, &mackey,
                         ptrlen_from_strbuf(passphrase_salt), &params);

    /*
     * Decrypt the private blob.
     */
    if (private_blob->len % ciphertype->blocklen)
        goto error;
    if (ciphertype == &ppk_cipher_aes256_cbc) {
        aes256_decrypt_pubkey(cipherkey.ptr, cipheriv.ptr,
                              private_blob->u, private_blob->len);
    }

    /*
     * Verify the MAC.
     */
    {
        unsigned char binary[32];
        char realmac[sizeof(binary) * 2 + 1];
        strbuf *macdata;
        bool free_macdata;

        const ssh2_macalg *mac_alg =
            fmt_version <= 2 ? &ssh_hmac_sha1 : &ssh_hmac_sha256;

        if (fmt_version == 1) {
            /* MAC (or hash) only covers the private blob. */
            macdata = private_blob;
            free_macdata = false;
        } else {
            macdata = strbuf_new_nm();
            put_stringz(macdata, alg->ssh_id);
            put_stringz(macdata, encryption);
            put_stringz(macdata, comment);
            put_string(macdata, public_blob->s,
                       public_blob->len);
            put_string(macdata, private_blob->s,
                       private_blob->len);
            free_macdata = true;
        }

        if (is_mac) {
            ssh2_mac *mac;

            mac = ssh2_mac_new(mac_alg, NULL);
            ssh2_mac_setkey(mac, mackey);
            ssh2_mac_start(mac);
            put_data(mac, macdata->s, macdata->len);
            ssh2_mac_genresult(mac, binary);
            ssh2_mac_free(mac);
        } else {
            hash_simple(&ssh_sha1, ptrlen_from_strbuf(macdata), binary);
        }

        if (free_macdata)
            strbuf_free(macdata);

        for (i = 0; i < mac_alg->len; i++)
            sprintf(realmac + 2 * i, "%02x", binary[i]);

        if (strcmp(mac, realmac)) {
            /* An incorrect MAC is an unconditional Error if the key is
             * unencrypted. Otherwise, it means Wrong Passphrase. */
            if (ciphertype->keylen != 0) {
                error = "wrong passphrase";
                ret = SSH2_WRONG_PASSPHRASE;
            } else {
                error = "MAC failed";
                ret = NULL;
            }
            goto error;
        }
    }

    /*
     * Create and return the key.
     */
    ret = snew(ssh2_userkey);
    ret->comment = comment;
    comment = NULL;
    ret->key = ssh_key_new_priv(
        alg, ptrlen_from_strbuf(public_blob),
        ptrlen_from_strbuf(private_blob));
    if (!ret->key) {
        sfree(ret);
        ret = NULL;
        error = "createkey failed";
        goto error;
    }
    error = NULL;

    /*
     * Error processing.
     */
  error:
    if (comment)
        sfree(comment);
    if (encryption)
        sfree(encryption);
    if (mac)
        sfree(mac);
    if (public_blob)
        strbuf_free(public_blob);
    if (private_blob)
        strbuf_free(private_blob);
    if (cipher_mac_keys_blob)
        strbuf_free(cipher_mac_keys_blob);
    strbuf_free(passphrase_salt);
    if (errorstr)
        *errorstr = error;
    return ret;
}